

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwWindowHint(int target,int hint)

{
  char *format;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    switch(target) {
    case 0x21001:
      _glfw.hints.framebuffer.redBits = hint;
      return;
    case 0x21002:
      _glfw.hints.framebuffer.greenBits = hint;
      return;
    case 0x21003:
      _glfw.hints.framebuffer.blueBits = hint;
      return;
    case 0x21004:
      _glfw.hints.framebuffer.alphaBits = hint;
      return;
    case 0x21005:
      _glfw.hints.framebuffer.depthBits = hint;
      return;
    case 0x21006:
      _glfw.hints.framebuffer.stencilBits = hint;
      return;
    case 0x21007:
      _glfw.hints.framebuffer.accumRedBits = hint;
      return;
    case 0x21008:
      _glfw.hints.framebuffer.accumGreenBits = hint;
      return;
    case 0x21009:
      _glfw.hints.framebuffer.accumBlueBits = hint;
      return;
    case 0x2100a:
      _glfw.hints.framebuffer.accumAlphaBits = hint;
      return;
    case 0x2100b:
      _glfw.hints.framebuffer.auxBuffers = hint;
      return;
    case 0x2100c:
      _glfw.hints.framebuffer.stereo = (uint)(hint != 0);
      return;
    case 0x2100d:
      _glfw.hints.framebuffer.samples = hint;
      return;
    case 0x2100e:
      _glfw.hints.framebuffer.sRGB = (uint)(hint != 0);
      return;
    case 0x2100f:
      _glfw.hints.refreshRate = hint;
      return;
    case 0x21010:
      _glfw.hints.framebuffer.doublebuffer = (uint)(hint != 0);
      return;
    }
    switch(target) {
    case 0x22001:
      _glfw.hints.context.api = hint;
      return;
    case 0x22002:
      _glfw.hints.context.major = hint;
      return;
    case 0x22003:
      _glfw.hints.context.minor = hint;
      return;
    case 0x22004:
      goto switchD_0010fcf3_caseD_22004;
    case 0x22005:
      _glfw.hints.context.robustness = hint;
      return;
    case 0x22006:
      _glfw.hints.context.forward = hint != 0;
      return;
    case 0x22007:
      _glfw.hints.context.debug = hint != 0;
      return;
    case 0x22008:
      _glfw.hints.context.profile = hint;
      return;
    case 0x22009:
      _glfw.hints.context.release = hint;
      return;
    default:
      switch(target) {
      case 0x20001:
        _glfw.hints.window.focused = hint != 0;
        return;
      case 0x20003:
        _glfw.hints.window.resizable = hint != 0;
        return;
      case 0x20004:
        _glfw.hints.window.visible = hint != 0;
        return;
      case 0x20005:
        _glfw.hints.window.decorated = hint != 0;
        return;
      case 0x20006:
        _glfw.hints.window.autoIconify = hint != 0;
        return;
      case 0x20007:
        _glfw.hints.window.floating = hint != 0;
        return;
      }
switchD_0010fcf3_caseD_22004:
      format = "Invalid window hint";
      error = 0x10003;
    }
  }
  _glfwInputError(error,format);
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.framebuffer.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.framebuffer.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.framebuffer.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.framebuffer.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.framebuffer.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.framebuffer.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.framebuffer.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.framebuffer.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.framebuffer.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.framebuffer.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.framebuffer.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.framebuffer.stereo = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.framebuffer.doublebuffer = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.framebuffer.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.framebuffer.sRGB = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.window.resizable = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_DECORATED:
            _glfw.hints.window.decorated = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_FOCUSED:
            _glfw.hints.window.focused = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.window.autoIconify = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_FLOATING:
            _glfw.hints.window.floating = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.window.visible = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.context.api = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.context.major = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.context.minor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.context.robustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.context.forward = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.context.debug = hint ? GL_TRUE : GL_FALSE;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.context.profile = hint;
            break;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.context.release = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint");
            break;
    }
}